

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

SampleAnalysis<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> * __thiscall
Catch::Benchmark::Detail::
analyse<std::chrono::duration<double,std::ratio<1l,1000000000l>>,__gnu_cxx::__normal_iterator<std::chrono::duration<double,std::ratio<1l,1000000000l>>*,std::vector<std::chrono::duration<double,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1000000000l>>>>>>
          (SampleAnalysis<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
           *__return_storage_ptr__,Detail *this,IConfig *cfg,
          Environment<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_> param_2,
          __normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>_>
          first,__normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>_>
                last)

{
  double confidence_level;
  Estimate<double> e;
  Estimate<double> e_00;
  IConfig *pIVar1;
  __normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>_>
  _Var2;
  bool bVar3;
  int n_resamples;
  ulong uVar4;
  size_type sVar5;
  back_insert_iterator<std::vector<double,_std::allocator<double>_>_> bVar6;
  iterator iVar7;
  iterator iVar8;
  iterator first_00;
  back_insert_iterator<std::vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>_>
  bVar9;
  reference pdVar10;
  int local_1dc [3];
  double local_1d0;
  duration<double,_std::ratio<1L,_1000000000L>_> local_1c8;
  value_type local_1c0;
  __normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>_>
  local_1b8;
  __normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>_>
  it;
  duration<double,_std::ratio<1L,_1000000000L>_> dStack_1a8;
  int i;
  duration<double,_std::ratio<1L,_1000000000L>_> mean;
  vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
  samples_1;
  undefined1 local_118 [8];
  vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
  samples2;
  anon_class_1_0_00000001 wrap_estimate;
  undefined1 local_e4 [8];
  OutlierClassification outliers;
  undefined1 auStack_c0 [8];
  bootstrap_analysis analysis;
  undefined1 local_40 [8];
  vector<double,_std::allocator<double>_> samples;
  IConfig *cfg_local;
  __normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>_>
  last_local;
  __normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>_>
  first_local;
  
  samples.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  cfg_local = (IConfig *)first._M_current;
  last_local._M_current = (duration<double,_std::ratio<1L,_1000000000L>_> *)cfg;
  uVar4 = (**(code **)(*(long *)this + 0xa8))();
  if ((uVar4 & 1) == 0) {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_40);
    sVar5 = __gnu_cxx::operator-
                      ((__normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>_>
                        *)&cfg_local,&last_local);
    std::vector<double,_std::allocator<double>_>::reserve
              ((vector<double,_std::allocator<double>_> *)local_40,sVar5);
    _Var2 = last_local;
    pIVar1 = cfg_local;
    bVar6 = std::back_inserter<std::vector<double,std::allocator<double>>>
                      ((vector<double,_std::allocator<double>_> *)local_40);
    analysis.outlier_variance =
         (double)std::
                 transform<__gnu_cxx::__normal_iterator<std::chrono::duration<double,std::ratio<1l,1000000000l>>*,std::vector<std::chrono::duration<double,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1000000000l>>>>>,std::back_insert_iterator<std::vector<double,std::allocator<double>>>,Catch::Benchmark::Detail::analyse<std::chrono::duration<double,std::ratio<1l,1000000000l>>,__gnu_cxx::__normal_iterator<std::chrono::duration<double,std::ratio<1l,1000000000l>>*,std::vector<std::chrono::duration<double,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1000000000l>>>>>>(Catch::IConfig_const&,Catch::Benchmark::Environment<std::chrono::duration<double,std::ratio<1l,1000000000l>>>,__gnu_cxx::__normal_iterator<std::chrono::duration<double,std::ratio<1l,1000000000l>>*,std::vector<std::chrono::duration<double,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1000000000l>>>>>,__gnu_cxx::__normal_iterator<std::chrono::duration<double,std::ratio<1l,1000000000l>>*,std::vector<std::chrono::duration<double,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1000000000l>>>>>)::_lambda(std::chrono::duration<double,std::ratio<1l,1000000000l>>)_1_>
                           (_Var2._M_current,pIVar1,bVar6.container);
    confidence_level =
         (double)(**(code **)((long)*samples.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage + 0xb8))();
    n_resamples = (**(code **)((long)*samples.super__Vector_base<double,_std::allocator<double>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage + 0xc0))();
    iVar7 = std::vector<double,_std::allocator<double>_>::begin
                      ((vector<double,_std::allocator<double>_> *)local_40);
    iVar8 = std::vector<double,_std::allocator<double>_>::end
                      ((vector<double,_std::allocator<double>_> *)local_40);
    outliers._12_8_ = iVar8;
    analyse_samples((bootstrap_analysis *)auStack_c0,confidence_level,n_resamples,
                    (iterator)iVar7._M_current,(iterator)iVar8._M_current);
    iVar7 = std::vector<double,_std::allocator<double>_>::begin
                      ((vector<double,_std::allocator<double>_> *)local_40);
    first_00 = std::vector<double,_std::allocator<double>_>::end
                         ((vector<double,_std::allocator<double>_> *)local_40);
    classify_outliers<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
              ((OutlierClassification *)local_e4,(Detail *)iVar7._M_current,
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               first_00._M_current,
               (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
               iVar8._M_current);
    std::
    vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
    ::vector((vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
              *)local_118);
    sVar5 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)local_40);
    std::
    vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
    ::reserve((vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
               *)local_118,sVar5);
    iVar7 = std::vector<double,_std::allocator<double>_>::begin
                      ((vector<double,_std::allocator<double>_> *)local_40);
    iVar8 = std::vector<double,_std::allocator<double>_>::end
                      ((vector<double,_std::allocator<double>_> *)local_40);
    bVar9 = std::
            back_inserter<std::vector<std::chrono::duration<double,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1000000000l>>>>>
                      ((vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
                        *)local_118);
    std::
    transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::back_insert_iterator<std::vector<std::chrono::duration<double,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1000000000l>>>>>,Catch::Benchmark::Detail::analyse<std::chrono::duration<double,std::ratio<1l,1000000000l>>,__gnu_cxx::__normal_iterator<std::chrono::duration<double,std::ratio<1l,1000000000l>>*,std::vector<std::chrono::duration<double,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1000000000l>>>>>>(Catch::IConfig_const&,Catch::Benchmark::Environment<std::chrono::duration<double,std::ratio<1l,1000000000l>>>,__gnu_cxx::__normal_iterator<std::chrono::duration<double,std::ratio<1l,1000000000l>>*,std::vector<std::chrono::duration<double,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1000000000l>>>>>,__gnu_cxx::__normal_iterator<std::chrono::duration<double,std::ratio<1l,1000000000l>>*,std::vector<std::chrono::duration<double,std::ratio<1l,1000000000l>>,std::allocator<std::chrono::duration<double,std::ratio<1l,1000000000l>>>>>)::_lambda(double)_1_>
              (iVar7._M_current,iVar8._M_current,bVar9.container);
    std::
    vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
    ::vector(&__return_storage_ptr__->samples,
             (vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
              *)local_118);
    e.lower_bound = analysis.mean.point;
    e.point = (double)auStack_c0;
    e.upper_bound = analysis.mean.lower_bound;
    e.confidence_interval = analysis.mean.upper_bound;
    analyse<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,___gnu_cxx::__normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>_>_>
    ::anon_class_1_0_00000001::operator()
              (&__return_storage_ptr__->mean,
               (anon_class_1_0_00000001 *)
               ((long)&samples2.
                       super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),e);
    e_00.lower_bound = analysis.standard_deviation.point;
    e_00.point = analysis.mean.confidence_interval;
    e_00.upper_bound = analysis.standard_deviation.lower_bound;
    e_00.confidence_interval = analysis.standard_deviation.upper_bound;
    analyse<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,___gnu_cxx::__normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>_>_>
    ::anon_class_1_0_00000001::operator()
              (&__return_storage_ptr__->standard_deviation,
               (anon_class_1_0_00000001 *)
               ((long)&samples2.
                       super__Vector_base<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),e_00);
    (__return_storage_ptr__->outliers).samples_seen = local_e4._0_4_;
    (__return_storage_ptr__->outliers).low_severe = local_e4._4_4_;
    (__return_storage_ptr__->outliers).low_mild = outliers.samples_seen;
    (__return_storage_ptr__->outliers).high_mild = outliers.low_severe;
    (__return_storage_ptr__->outliers).high_severe = outliers.low_mild;
    __return_storage_ptr__->outlier_variance = analysis.standard_deviation.confidence_interval;
    std::
    vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
    ::~vector((vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
               *)local_118);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_40);
  }
  else {
    std::
    vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
    ::vector((vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
              *)&mean);
    sVar5 = __gnu_cxx::operator-
                      ((__normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>_>
                        *)&cfg_local,&last_local);
    std::
    vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
    ::reserve((vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
               *)&mean,sVar5);
    memset(&stack0xfffffffffffffe58,0,8);
    it._M_current._4_4_ = 0;
    local_1b8 = (__normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>_>
                 )(__normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>_>
                   )last_local._M_current;
    while( true ) {
      bVar3 = __gnu_cxx::operator<
                        (&local_1b8,
                         (__normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>_>
                          *)&cfg_local);
      if (!bVar3) break;
      pdVar10 = __gnu_cxx::
                __normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>_>
                ::operator*(&local_1b8);
      local_1c0.__r = pdVar10->__r;
      std::
      vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
      ::push_back((vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
                   *)&mean,&local_1c0);
      pdVar10 = __gnu_cxx::
                __normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>_>
                ::operator*(&local_1b8);
      local_1c8.__r = pdVar10->__r;
      std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>::operator+=
                (&stack0xfffffffffffffe58,&local_1c8);
      __gnu_cxx::
      __normal_iterator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_*,_std::vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>_>
      ::operator++(&local_1b8);
      it._M_current._4_4_ = it._M_current._4_4_ + 1;
    }
    local_1d0 = (double)it._M_current._4_4_;
    std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>::operator/=
              (&stack0xfffffffffffffe58,&local_1d0);
    std::
    vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
    ::vector(&__return_storage_ptr__->samples,
             (vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
              *)&mean);
    (__return_storage_ptr__->mean).point.__r = dStack_1a8.__r;
    (__return_storage_ptr__->mean).lower_bound.__r = dStack_1a8.__r;
    (__return_storage_ptr__->mean).upper_bound.__r = dStack_1a8.__r;
    (__return_storage_ptr__->mean).confidence_interval = 0.0;
    local_1dc[2] = 0;
    std::chrono::duration<double,std::ratio<1l,1000000000l>>::duration<int,void>
              ((duration<double,std::ratio<1l,1000000000l>> *)
               &__return_storage_ptr__->standard_deviation,local_1dc + 2);
    local_1dc[1] = 0;
    std::chrono::duration<double,std::ratio<1l,1000000000l>>::duration<int,void>
              ((duration<double,std::ratio<1l,1000000000l>> *)
               &(__return_storage_ptr__->standard_deviation).lower_bound,local_1dc + 1);
    local_1dc[0] = 0;
    std::chrono::duration<double,std::ratio<1l,1000000000l>>::duration<int,void>
              ((duration<double,std::ratio<1l,1000000000l>> *)
               &(__return_storage_ptr__->standard_deviation).upper_bound,local_1dc);
    (__return_storage_ptr__->standard_deviation).confidence_interval = 0.0;
    (__return_storage_ptr__->outliers).samples_seen = 0;
    (__return_storage_ptr__->outliers).low_severe = 0;
    (__return_storage_ptr__->outliers).low_mild = 0;
    (__return_storage_ptr__->outliers).high_mild = 0;
    (__return_storage_ptr__->outliers).high_severe = 0;
    __return_storage_ptr__->outlier_variance = 0.0;
    std::
    vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
    ::~vector((vector<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>,_std::allocator<std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>_>
               *)&mean);
  }
  return __return_storage_ptr__;
}

Assistant:

SampleAnalysis<Duration> analyse(const IConfig &cfg, Environment<Duration>, Iterator first, Iterator last) {
                if (!cfg.benchmarkNoAnalysis()) {
                    std::vector<double> samples;
                    samples.reserve(last - first);
                    std::transform(first, last, std::back_inserter(samples), [](Duration d) { return d.count(); });

                    auto analysis = Catch::Benchmark::Detail::analyse_samples(cfg.benchmarkConfidenceInterval(), cfg.benchmarkResamples(), samples.begin(), samples.end());
                    auto outliers = Catch::Benchmark::Detail::classify_outliers(samples.begin(), samples.end());

                    auto wrap_estimate = [](Estimate<double> e) {
                        return Estimate<Duration> {
                            Duration(e.point),
                                Duration(e.lower_bound),
                                Duration(e.upper_bound),
                                e.confidence_interval,
                        };
                    };
                    std::vector<Duration> samples2;
                    samples2.reserve(samples.size());
                    std::transform(samples.begin(), samples.end(), std::back_inserter(samples2), [](double d) { return Duration(d); });
                    return {
                        std::move(samples2),
                        wrap_estimate(analysis.mean),
                        wrap_estimate(analysis.standard_deviation),
                        outliers,
                        analysis.outlier_variance,
                    };
                } else {
                    std::vector<Duration> samples;
                    samples.reserve(last - first);

                    Duration mean = Duration(0);
                    int i = 0;
                    for (auto it = first; it < last; ++it, ++i) {
                        samples.push_back(Duration(*it));
                        mean += Duration(*it);
                    }
                    mean /= i;

                    return {
                        std::move(samples),
                        Estimate<Duration>{mean, mean, mean, 0.0},
                        Estimate<Duration>{Duration(0), Duration(0), Duration(0), 0.0},
                        OutlierClassification{},
                        0.0
                    };
                }
            }